

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::loadDesc(SPxBasisBase<double> *this,Desc *ds)

{
  double dVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  Status SVar5;
  int iVar6;
  int iVar7;
  Status *pSVar8;
  SVectorBase<double> *pSVar9;
  double *pdVar10;
  SPxId *pSVar11;
  SVectorBase<double> **ppSVar12;
  long in_RSI;
  long in_RDI;
  SPxColId id_1;
  SPxRowId id;
  Verbosity old_verbosity;
  bool consistent;
  int j;
  int i;
  SPxId none;
  undefined4 in_stack_ffffffffffffff28;
  Status in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  SPxLPBase<double> *in_stack_ffffffffffffff38;
  SPxRowId *in_stack_ffffffffffffff48;
  SPxColId *cid;
  SPxSolverBase<double> *in_stack_ffffffffffffff50;
  SPxBasisBase<double> *in_stack_ffffffffffffff58;
  Status in_stack_ffffffffffffff70;
  DataKey local_3c;
  DataKey local_34;
  undefined4 local_2c;
  Verbosity local_28;
  byte local_21;
  int local_20;
  int local_1c;
  undefined8 local_18;
  long local_10;
  
  local_10 = in_RSI;
  SPxId::SPxId((SPxId *)0x25f0a4);
  local_21 = 1;
  if ((*(long *)(in_RDI + 0x118) != 0) &&
     (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x118)), 4 < (int)VVar3)) {
    local_28 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x118));
    local_2c = 5;
    (**(code **)(**(long **)(in_RDI + 0x118) + 0x10))(*(long **)(in_RDI + 0x118),&local_2c);
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    (**(code **)(**(long **)(in_RDI + 0x118) + 0x10))(*(long **)(in_RDI + 0x118),&local_28);
  }
  *(undefined8 *)(in_RDI + 0xac) = local_18;
  *(undefined8 *)(in_RDI + 0xb4) = local_18;
  *(undefined4 *)(in_RDI + 0xbc) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x7c) = 0;
  if (local_10 != in_RDI + 0xd0) {
    Desc::operator=((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    (Desc *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    setRep((SPxBasisBase<double> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  *(undefined4 *)(in_RDI + 0x84) = 0;
  local_20 = 0;
  for (local_1c = 0; iVar7 = local_1c,
      iVar4 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x25f235), iVar7 < iVar4;
      local_1c = local_1c + 1) {
    pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
    if (*pSVar8 < ~P_FREE) {
      pdVar10 = SPxLPBase<double>::lhs
                          ((SPxLPBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff2c);
      dVar1 = *pdVar10;
      pdVar10 = SPxLPBase<double>::rhs
                          ((SPxLPBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff2c);
      if ((dVar1 != *pdVar10) || (NAN(dVar1) || NAN(*pdVar10))) {
        pdVar10 = SPxLPBase<double>::lhs
                            ((SPxLPBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
        dVar1 = *pdVar10;
        pdVar10 = (double *)infinity();
        if (-*pdVar10 < dVar1) {
          pdVar10 = SPxLPBase<double>::rhs
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff2c);
          dVar1 = *pdVar10;
          pdVar10 = (double *)infinity();
          if (((*pdVar10 <= dVar1) ||
              (pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                         in_stack_ffffffffffffff30),
                                        in_stack_ffffffffffffff2c), *pSVar8 == P_ON_LOWER)) ||
             ((pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                         in_stack_ffffffffffffff30),
                                        in_stack_ffffffffffffff2c), *pSVar8 != P_ON_UPPER &&
              (pdVar10 = SPxLPBase<double>::maxRowObj
                                   ((SPxLPBase<double> *)
                                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                    in_stack_ffffffffffffff2c), *pdVar10 <= 0.0)))) {
            pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff2c);
            *pSVar8 = P_ON_LOWER;
            goto LAB_0025f4ab;
          }
        }
        pdVar10 = SPxLPBase<double>::rhs
                            ((SPxLPBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
        dVar1 = *pdVar10;
        pdVar10 = (double *)infinity();
        if (*pdVar10 <= dVar1) {
          pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c);
          *pSVar8 = P_FREE;
        }
        else {
          pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c);
          *pSVar8 = P_ON_UPPER;
        }
      }
      else {
        pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),
                                 in_stack_ffffffffffffff2c);
        *pSVar8 = P_FIXED;
      }
    }
    else {
      SVar5 = dualRowStatus(in_stack_ffffffffffffff58,
                            (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      pSVar8 = Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                               ,in_stack_ffffffffffffff2c);
      *pSVar8 = SVar5;
    }
LAB_0025f4ab:
    Desc::rowStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
    bVar2 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
    iVar7 = local_20;
    if (bVar2) {
      iVar4 = DataArray<const_soplex::SVectorBase<double>_*>::size
                        ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28));
      if (iVar7 == iVar4) {
        local_21 = 0;
        break;
      }
      local_34 = (DataKey)SPxLPBase<double>::rId
                                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      pSVar11 = DataArray<soplex::SPxId>::operator[]
                          ((DataArray<soplex::SPxId> *)(in_RDI + 0x10),local_20);
      SPxId::operator=(pSVar11,(SPxRowId *)&local_34);
      pSVar9 = SPxSolverBase<double>::vector(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      ppSVar12 = DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                           ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28),
                            local_20);
      iVar7 = local_20;
      *ppSVar12 = pSVar9;
      local_20 = local_20 + 1;
      ppSVar12 = DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                           ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28),iVar7)
      ;
      iVar7 = SVectorBase<double>::size(*ppSVar12);
      *(int *)(in_RDI + 0x84) = iVar7 + *(int *)(in_RDI + 0x84);
    }
  }
  local_1c = 0;
  do {
    iVar7 = local_1c;
    iVar4 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x25f61e);
    if (iVar4 <= iVar7) {
LAB_0025f9d1:
      iVar4 = local_20;
      iVar6 = DataArray<const_soplex::SVectorBase<double>_*>::size
                        ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28));
      if (iVar4 < iVar6) {
        local_21 = 0;
      }
      if ((local_21 & 1) == 0) {
        restoreInitialBasis((SPxBasisBase<double> *)CONCAT44(iVar7,in_stack_ffffffffffffff70));
      }
      else {
        *(undefined1 *)(in_RDI + 0x40) = 1;
      }
      *(undefined1 *)(in_RDI + 0x50) = 0;
      if (*(long *)(in_RDI + 0x48) != 0) {
        (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))();
      }
      return;
    }
    pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
    if (*pSVar8 < ~P_FREE) {
      pdVar10 = SPxLPBase<double>::lower
                          ((SPxLPBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff2c);
      dVar1 = *pdVar10;
      pdVar10 = SPxLPBase<double>::upper
                          ((SPxLPBase<double> *)
                           CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                           in_stack_ffffffffffffff2c);
      if ((dVar1 != *pdVar10) || (NAN(dVar1) || NAN(*pdVar10))) {
        pdVar10 = SPxLPBase<double>::lower
                            ((SPxLPBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
        dVar1 = *pdVar10;
        pdVar10 = (double *)infinity();
        if (-*pdVar10 < dVar1) {
          pdVar10 = SPxLPBase<double>::upper
                              ((SPxLPBase<double> *)
                               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff2c);
          in_stack_ffffffffffffff58 = (SPxBasisBase<double> *)*pdVar10;
          pdVar10 = (double *)infinity();
          if (((*pdVar10 <= (double)in_stack_ffffffffffffff58) ||
              (pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                         in_stack_ffffffffffffff30),
                                        in_stack_ffffffffffffff2c), *pSVar8 == P_ON_LOWER)) ||
             ((pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                         in_stack_ffffffffffffff30),
                                        in_stack_ffffffffffffff2c), *pSVar8 != P_ON_UPPER &&
              (pdVar10 = SPxLPBase<double>::maxObj
                                   ((SPxLPBase<double> *)
                                    CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                                    in_stack_ffffffffffffff2c), *pdVar10 <= 0.0)))) {
            pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                      in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff2c);
            *pSVar8 = P_ON_LOWER;
            goto LAB_0025f885;
          }
        }
        pdVar10 = SPxLPBase<double>::upper
                            ((SPxLPBase<double> *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             in_stack_ffffffffffffff2c);
        in_stack_ffffffffffffff50 = (SPxSolverBase<double> *)*pdVar10;
        pdVar10 = (double *)infinity();
        if (*pdVar10 <= (double)in_stack_ffffffffffffff50) {
          pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c);
          *pSVar8 = P_FREE;
        }
        else {
          pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                    in_stack_ffffffffffffff30),
                                   in_stack_ffffffffffffff2c);
          *pSVar8 = P_ON_UPPER;
        }
      }
      else {
        pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,
                                                  in_stack_ffffffffffffff30),
                                 in_stack_ffffffffffffff2c);
        *pSVar8 = P_FIXED;
      }
    }
    else {
      in_stack_ffffffffffffff70 =
           dualColStatus(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
      pSVar8 = Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                               ,in_stack_ffffffffffffff2c);
      *pSVar8 = in_stack_ffffffffffffff70;
    }
LAB_0025f885:
    cid = *(SPxColId **)(in_RDI + 8);
    Desc::colStatus((Desc *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff2c);
    bVar2 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       in_stack_ffffffffffffff2c);
    iVar4 = local_20;
    if (bVar2) {
      iVar6 = DataArray<const_soplex::SVectorBase<double>_*>::size
                        ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28));
      if (iVar4 == iVar6) {
        local_21 = 0;
        goto LAB_0025f9d1;
      }
      local_3c = (DataKey)SPxLPBase<double>::cId
                                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
      pSVar11 = DataArray<soplex::SPxId>::operator[]
                          ((DataArray<soplex::SPxId> *)(in_RDI + 0x10),local_20);
      SPxId::operator=(pSVar11,(SPxColId *)&local_3c);
      in_stack_ffffffffffffff38 =
           (SPxLPBase<double> *)SPxSolverBase<double>::vector(in_stack_ffffffffffffff50,cid);
      ppSVar12 = DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                           ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28),
                            local_20);
      iVar7 = local_20;
      *ppSVar12 = (SVectorBase<double> *)in_stack_ffffffffffffff38;
      local_20 = local_20 + 1;
      ppSVar12 = DataArray<const_soplex::SVectorBase<double>_*>::operator[]
                           ((DataArray<const_soplex::SVectorBase<double>_*> *)(in_RDI + 0x28),iVar7)
      ;
      iVar7 = SVectorBase<double>::size(*ppSVar12);
      *(int *)(in_RDI + 0x84) = iVar7 + *(int *)(in_RDI + 0x84);
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void SPxBasisBase<R>::loadDesc(const Desc& ds)
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);
   assert(ds.nRows() == theLP->nRows());
   assert(ds.nCols() == theLP->nCols());

   SPxId none;
   int   i;
   int   j;
   bool consistent = true;

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS02 loading of Basis invalidates factorization"
                 << std::endl;)

   lastin      = none;
   lastout     = none;
   lastidx     = -1;
   iterCount   = 0;
   updateCount = 0;

   if(&ds != &thedesc)
   {
      thedesc = ds;
      setRep();
   }

   assert(theLP->dim() == matrix.size());

   nzCount = 0;

   for(j = i = 0; i < theLP->nRows(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.rowStatus(i) >= 0)
         thedesc.rowStatus(i) = dualRowStatus(i);
      else if(theLP->SPxLPBase<R>::lhs(i) == theLP->SPxLPBase<R>::rhs(i))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lhs(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::rhs(i) >= R(infinity)
                  || thedesc.rowStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.rowStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxRowObj(i) <= 0)))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::rhs(i) < R(infinity))
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.rowStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxRowId id = theLP->SPxLPBase<R>::rId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   for(i = 0; i < theLP->nCols(); ++i)
   {
      /* for columns and rows with D_... status, the correct D_... status depends on bounds and sides; if a basis
       * descriptor is loaded after changing bounds or sides, e.g. in the refine() method, we have to correct them
       */
      if(thedesc.colStatus(i) >= 0)
         thedesc.colStatus(i) = dualColStatus(i);
      else if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) > R(-infinity)
              && (theLP->SPxLPBase<R>::upper(i) >= R(infinity)
                  || thedesc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || (thedesc.colStatus(i) != SPxBasisBase<R>::Desc::P_ON_UPPER
                      && theLP->SPxLPBase<R>::maxObj(i) <= 0)))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      else if(theLP->SPxLPBase<R>::upper(i) < R(infinity))
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      else
         thedesc.colStatus(i) = SPxBasisBase<R>::Desc::P_FREE;

      if(theLP->isBasic(thedesc.colStatus(i)))
      {
         assert(theLP->dim() == matrix.size());
         assert(j <= matrix.size());

         if(j == matrix.size())
         {
            // too many basic variables
            consistent = false;
            break;
         }

         SPxColId id = theLP->SPxLPBase<R>::cId(i);
         theBaseId[j] = id;
         matrix[j] = &theLP->vector(id);
         nzCount += matrix[j++]->size();
      }
   }

   if(j < matrix.size())
      consistent = false;  // not enough basic variables

   /* if dimensions are inconsistent, restore slack basis
    * if dimensions are consistent, then we have setup a correct matrix
    */
   if(!consistent)
      restoreInitialBasis();
   else
      matrixIsSetup = true;

   assert(isDescValid(thedesc));

   factorized = false;

   if(factor != nullptr)
      factor->clear();
}